

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

bool __thiscall FMapInfoParser::CheckFloat(FMapInfoParser *this)

{
  bool bVar1;
  
  if (this->format_type != 2) {
    bVar1 = FScanner::CheckFloat(&this->sc);
    return bVar1;
  }
  bVar1 = FScanner::CheckString(&this->sc,",");
  if (bVar1) {
    FScanner::MustGetFloat(&this->sc);
  }
  return bVar1;
}

Assistant:

bool FMapInfoParser::CheckFloat()
{
	if (format_type == FMT_New) 
	{
		if (sc.CheckString(","))
		{
			sc.MustGetFloat();
			return true;
		}
		return false;
	}
	else return sc.CheckFloat();
}